

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_hash.c
# Opt level: O3

ion_err_t oah_destroy(ion_hashmap_t *hash_map)

{
  ion_err_t iVar1;
  
  hash_map->compute_hash = (_func_int_ion_hashmap_t_ptr_ion_key_t_int *)0x0;
  hash_map->map_size = 0;
  (hash_map->super).record.key_size = 0;
  (hash_map->super).record.value_size = 0;
  if (hash_map->entry == (char *)0x0) {
    iVar1 = '\x04';
  }
  else {
    free(hash_map->entry);
    hash_map->entry = (char *)0x0;
    iVar1 = '\0';
  }
  return iVar1;
}

Assistant:

ion_err_t
oah_destroy(
	ion_hashmap_t *hash_map
) {
	hash_map->compute_hash				= NULL;
	hash_map->map_size					= 0;
	hash_map->super.record.key_size		= 0;
	hash_map->super.record.value_size	= 0;

	if (hash_map->entry != NULL) {
		/* check to ensure that you are not freeing something already free */
		free(hash_map->entry);
		hash_map->entry = NULL;	/*  */
		return err_ok;
	}
	else {
		return err_dictionary_destruction_error;
	}
}